

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall pbrt::ParsedScene::ColorSpace(ParsedScene *this,string *name,FileLoc loc)

{
  RGBColorSpace *pRVar1;
  string local_30;
  
  pRVar1 = RGBColorSpace::GetNamed(name);
  if (pRVar1 == (RGBColorSpace *)0x0) {
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    detail::stringPrintfRecursive<std::__cxx11::string_const&>
              (&local_30,"%s: color space unknown",name);
    Error(&loc,local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,
                      CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,
                               local_30.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (this->graphicsState).colorSpace = pRVar1;
  }
  return;
}

Assistant:

void ParsedScene::ColorSpace(const std::string &name, FileLoc loc) {
    if (const RGBColorSpace *cs = RGBColorSpace::GetNamed(name))
        graphicsState.colorSpace = cs;
    else
        Error(&loc, "%s: color space unknown", name);
}